

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSolve.c
# Opt level: O0

DdNode * cuddVerifySol(DdManager *bdd,DdNode *F,DdNode **G,int *yIndex,int n)

{
  DdNode *pDVar1;
  int local_4c;
  DdNode *pDStack_48;
  int j;
  DdNode *R;
  DdNode *w;
  int n_local;
  int *yIndex_local;
  DdNode **G_local;
  DdNode *F_local;
  DdManager *bdd_local;
  
  *(int *)(((ulong)F & 0xfffffffffffffffe) + 4) = *(int *)(((ulong)F & 0xfffffffffffffffe) + 4) + 1;
  local_4c = n + -1;
  pDStack_48 = F;
  while( true ) {
    if (local_4c < 0) {
      *(int *)(((ulong)pDStack_48 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDStack_48 & 0xfffffffffffffffe) + 4) + -1;
      return pDStack_48;
    }
    pDVar1 = Cudd_bddCompose(bdd,pDStack_48,G[local_4c],yIndex[local_4c]);
    if (pDVar1 == (DdNode *)0x0) break;
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(bdd,pDStack_48);
    local_4c = local_4c + -1;
    pDStack_48 = pDVar1;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddVerifySol(
  DdManager * bdd,
  DdNode * F /* the left-hand side of the equation */,
  DdNode ** G /* the array of solutions */,
  int * yIndex /* array holding the y variable indices */,
  int  n /* number of unknowns */)
{
    DdNode *w, *R;

    int j;

    R = F;
    cuddRef(R);
    for(j = n - 1; j >= 0; j--) {
         w = Cudd_bddCompose(bdd, R, G[j], yIndex[j]);
        if (w) {
            cuddRef(w);
        } else {
            return(NULL); 
        }
        Cudd_RecursiveDeref(bdd,R);
        R = w;
    }

    cuddDeref(R);

    return(R);

}